

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O2

__pid_t __thiscall depspawn::internal::TaskPool::wait(TaskPool *this,void *__stat_loc)

{
  char cVar1;
  __pid_t _Var2;
  __pid_t extraout_EAX;
  
  cVar1 = (char)__stat_loc;
  do {
    empty_queue(this);
  } while ((this->busy_threads_).super___atomic_base<int>._M_i != 0);
  this->finish_ = true;
  _Var2 = ThreadPool::wait(&this->thread_pool_,__stat_loc);
  if (cVar1 != '\0') {
    launch_threads(this);
    return extraout_EAX;
  }
  return _Var2;
}

Assistant:

void wait(const bool relaunch_threads = true)
  {
    do {
      empty_queue();
    } while(busy_threads_.load(std::memory_order_relaxed));

    finish_ = true;
    thread_pool_.wait();

    if (relaunch_threads) {
      launch_threads();
    }
  }